

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcapi_script.cpp
# Opt level: O2

int CfdGetTaprootScriptTreeSrting(void *handle,void *tree_handle,char **tree_string)

{
  vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> *this;
  reference this_00;
  reference this_01;
  char *pcVar1;
  string tree_str;
  string local_38;
  
  cfd::Initialize();
  std::__cxx11::string::string((string *)&tree_str,"TapscriptTree",(allocator *)&local_38);
  cfd::capi::CheckBuffer(tree_handle,&tree_str);
  std::__cxx11::string::~string((string *)&tree_str);
  tree_str._M_dataplus._M_p = (pointer)&tree_str.field_2;
  tree_str._M_string_length = 0;
  tree_str.field_2._M_local_buf[0] = '\0';
  this = *(vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_> **)
          ((long)tree_handle + 0x18);
  if ((this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_start ==
      (this->super__Vector_base<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>).
      _M_impl.super__Vector_impl_data._M_finish) {
    this_01 = std::
              vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>::
              at(*(vector<cfd::core::TaprootScriptTree,_std::allocator<cfd::core::TaprootScriptTree>_>
                   **)((long)tree_handle + 0x10),0);
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_38,&this_01->super_TapBranch);
  }
  else {
    this_00 = std::vector<cfd::core::TapBranch,_std::allocator<cfd::core::TapBranch>_>::at(this,0);
    cfd::core::TapBranch::ToString_abi_cxx11_(&local_38,this_00);
  }
  std::__cxx11::string::operator=((string *)&tree_str,(string *)&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  if (tree_string != (char **)0x0) {
    pcVar1 = cfd::capi::CreateString(&tree_str);
    *tree_string = pcVar1;
  }
  std::__cxx11::string::~string((string *)&tree_str);
  return 0;
}

Assistant:

int CfdGetTaprootScriptTreeSrting(
    void* handle, void* tree_handle, char** tree_string) {
  int result = CfdErrorCode::kCfdUnknownError;
  try {
    cfd::Initialize();
    CheckBuffer(tree_handle, kPrefixTapscriptTree);
    CfdCapiTapscriptTree* buffer =
        static_cast<CfdCapiTapscriptTree*>(tree_handle);
    std::string tree_str;
    if (!buffer->branch_buffer->empty()) {
      tree_str = buffer->branch_buffer->at(0).ToString();
    } else {
      tree_str = buffer->tree_buffer->at(0).ToString();
    }

    if (tree_string != nullptr) {
      *tree_string = CreateString(tree_str);
    }
    return CfdErrorCode::kCfdSuccess;
  } catch (const CfdException& except) {
    result = SetLastError(handle, except);
  } catch (const std::exception& std_except) {
    SetLastFatalError(handle, std_except.what());
  } catch (...) {
    SetLastFatalError(handle, "unknown error.");
  }
  return result;
}